

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

int32_t __thiscall icu_63::RuleBasedBreakIterator::handleNext(RuleBasedBreakIterator *this)

{
  UText *ut;
  UChar UVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  RBBIStateTable *pRVar6;
  UTrie2 *pUVar7;
  uint16_t *puVar8;
  long lVar9;
  int64_t iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long index;
  ulong local_98;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  long local_48;
  RuleBasedBreakIterator *local_40;
  uint32_t *local_38;
  
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  pRVar6 = this->fData->fForwardTable;
  uVar4 = pRVar6->fRowLen;
  uVar12 = (ulong)uVar4;
  this->fRuleStatusIndex = 0;
  this->fDictionaryCharCount = 0;
  uVar5 = this->fPosition;
  index = (long)(int)uVar5;
  ut = &this->fText;
  lVar9 = index - (this->fText).chunkNativeStart;
  if (((lVar9 < 0) || ((this->fText).nativeIndexingLimit <= lVar9)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[lVar9])) {
    utext_setNativeIndex_63(ut,index);
  }
  else {
    (this->fText).chunkOffset = (int32_t)lVar9;
  }
  iVar11 = (this->fText).chunkOffset;
  if ((iVar11 < (this->fText).chunkLength) &&
     (UVar1 = (this->fText).chunkContents[iVar11], uVar16 = (ulong)(ushort)UVar1,
     (ushort)UVar1 < 0xd800)) {
    (this->fText).chunkOffset = iVar11 + 1;
  }
  else {
    uVar18 = utext_next32_63(ut);
    uVar16 = (ulong)uVar18;
  }
  if ((int)uVar16 == -1) {
    this->fDone = '\x01';
    local_8c = 0xffffffff;
  }
  else {
    local_48 = index;
    uVar18 = pRVar6->fFlags & 2;
    uVar13 = (ulong)uVar18;
    uVar17 = uVar18 >> 1 ^ 1;
    local_38 = &pRVar6[1].fRowLen;
    local_98 = (ulong)uVar5;
    local_40 = this;
    uVar18 = (uint)local_88;
    do {
      uVar15 = (uint)uVar16;
      if (uVar15 == 0xffffffff) {
        if (uVar17 == 2) goto LAB_002a91fc;
        uVar13 = 1;
        uVar17 = 2;
      }
      if (uVar17 == 1) {
        pUVar7 = this->fData->fTrie;
        puVar8 = pUVar7->index;
        if (uVar15 < 0xd800) {
          uVar2 = puVar8[uVar16 >> 5];
LAB_002a8faa:
          iVar11 = (uVar15 & 0x1f) + (uint)uVar2 * 4;
        }
        else {
          if (uVar15 < 0x10000) {
            uVar13 = (ulong)((int)(uVar16 >> 5) + 0x140);
            if (0xdbff < (int)uVar15) {
              uVar13 = uVar16 >> 5;
            }
LAB_002a8fa6:
            uVar2 = puVar8[uVar13];
            goto LAB_002a8faa;
          }
          if (uVar15 < 0x110000) {
            if ((int)uVar15 < pUVar7->highStart) {
              uVar13 = (ulong)(((uint)(uVar16 >> 5) & 0x3f) + (uint)puVar8[(uVar16 >> 0xb) + 0x820])
              ;
              goto LAB_002a8fa6;
            }
            iVar11 = pUVar7->highValueIndex;
          }
          else {
            iVar11 = pUVar7->indexLength + 0x80;
          }
        }
        uVar2 = puVar8[iVar11];
        uVar13 = (ulong)uVar2;
        if ((uVar2 >> 0xe & 1) != 0) {
          this->fDictionaryCharCount = this->fDictionaryCharCount + 1;
          uVar13 = (ulong)(uVar2 & 0xbfff);
        }
      }
      uVar2 = *(ushort *)((long)local_38 + uVar13 * 2 + uVar12);
      uVar12 = (ulong)(uVar4 * uVar2);
      if (*(short *)(pRVar6->fTableData + uVar12) == -1) {
        if (uVar17 != 0) {
          uVar15 = (this->fText).chunkOffset;
          if ((this->fText).nativeIndexingLimit < (int)uVar15) {
            local_98 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
          }
          else {
            local_98 = (ulong)uVar15 + (this->fText).chunkNativeStart;
          }
        }
        this->fRuleStatusIndex = (int)*(short *)(pRVar6[1].fTableData + (uVar12 - 0x10));
      }
      if (*(short *)(pRVar6->fTableData + uVar12) < 1) {
LAB_002a90bb:
        sVar3 = *(short *)(pRVar6->fTableData + uVar12 + 2);
        if (sVar3 != 0) {
          iVar11 = (this->fText).chunkOffset;
          if ((this->fText).nativeIndexingLimit < iVar11) {
            iVar10 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
            iVar11 = (int)iVar10;
            this = local_40;
          }
          else {
            iVar11 = iVar11 + (int)(this->fText).chunkNativeStart;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          else {
            uVar14 = 0;
            do {
              if (*(short *)((long)&local_68 + uVar14 * 2 + 4) == sVar3) {
                *(int *)((long)&local_88 + uVar14 * 4 + 4) = iVar11;
                goto LAB_002a915c;
              }
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
          if (6 < uVar18) {
            uVar18 = 7;
          }
          *(short *)((long)&local_68 + (ulong)uVar18 * 2 + 4) = sVar3;
          *(int *)((long)&local_88 + (ulong)uVar18 * 4 + 4) = iVar11;
          uVar18 = uVar18 + 1;
        }
LAB_002a915c:
        if (uVar2 == 0) {
          iVar11 = 2;
        }
        else {
          if (uVar17 == 1) {
            iVar11 = (this->fText).chunkOffset;
            if ((iVar11 < (this->fText).chunkLength) &&
               (UVar1 = (this->fText).chunkContents[iVar11], uVar16 = (ulong)(ushort)UVar1,
               (ushort)UVar1 < 0xd800)) {
              (this->fText).chunkOffset = iVar11 + 1;
            }
            else {
              uVar17 = utext_next32_63(ut);
              uVar16 = (ulong)uVar17;
            }
            uVar17 = 1;
          }
          else {
            uVar17 = uVar17 + (uVar17 == 0);
          }
          iVar11 = 0;
        }
      }
      else {
        uVar15 = 0xffffffff;
        if (0 < (int)uVar18) {
          uVar14 = 0;
          do {
            if (*(short *)((long)&local_68 + uVar14 * 2 + 4) ==
                *(short *)(pRVar6->fTableData + uVar12)) {
              uVar15 = *(uint *)((long)&local_88 + uVar14 * 4 + 4);
              break;
            }
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
        if (-1 < (int)uVar15) {
          this->fRuleStatusIndex = (int)*(short *)(pRVar6[1].fTableData + (uVar12 - 0x10));
          this->fPosition = uVar15;
          local_8c = uVar15;
        }
        iVar11 = 1;
        if ((int)uVar15 < 0) goto LAB_002a90bb;
      }
    } while (iVar11 == 0);
    if (iVar11 == 2) {
LAB_002a91fc:
      local_88 = CONCAT44(local_88._4_4_,uVar18);
      local_8c = (uint)local_98;
      if ((uint)local_98 == uVar5) {
        utext_setNativeIndex_63(ut,local_48);
        utext_next32_63(ut);
        iVar10 = utext_getNativeIndex_63(ut);
        local_8c = (uint)iVar10;
        this->fRuleStatusIndex = 0;
      }
      this->fPosition = local_8c;
    }
  }
  return local_8c;
}

Assistant:

int32_t RuleBasedBreakIterator::handleNext() {
    int32_t             state;
    uint16_t            category        = 0;
    RBBIRunMode         mode;

    RBBIStateTableRow  *row;
    UChar32             c;
    LookAheadResults    lookAheadMatches;
    int32_t             result             = 0;
    int32_t             initialPosition    = 0;
    const RBBIStateTable *statetable       = fData->fForwardTable;
    const char         *tableData          = statetable->fTableData;
    uint32_t            tableRowLen        = statetable->fRowLen;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPuts("Handle Next   pos   char  state category");
        }
    #endif

    // handleNext alway sets the break tag value.
    // Set the default for it.
    fRuleStatusIndex = 0;

    fDictionaryCharCount = 0;

    // if we're already at the end of the text, return DONE.
    initialPosition = fPosition;
    UTEXT_SETNATIVEINDEX(&fText, initialPosition);
    result          = initialPosition;
    c               = UTEXT_NEXT32(&fText);
    if (c==U_SENTINEL) {
        fDone = TRUE;
        return UBRK_DONE;
    }

    //  Set the initial state for the state machine
    state = START_STATE;
    row = (RBBIStateTableRow *)
            //(statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


    mode     = RBBI_RUN;
    if (statetable->fFlags & RBBI_BOF_REQUIRED) {
        category = 2;
        mode     = RBBI_START;
    }


    // loop until we reach the end of the text or transition to state 0
    //
    for (;;) {
        if (c == U_SENTINEL) {
            // Reached end of input string.
            if (mode == RBBI_END) {
                // We have already run the loop one last time with the
                //   character set to the psueudo {eof} value.  Now it is time
                //   to unconditionally bail out.
                break;
            }
            // Run the loop one last time with the fake end-of-input character category.
            mode = RBBI_END;
            category = 1;
        }

        //
        // Get the char category.  An incoming category of 1 or 2 means that
        //      we are preset for doing the beginning or end of input, and
        //      that we shouldn't get a category from an actual text input character.
        //
        if (mode == RBBI_RUN) {
            // look up the current character's character category, which tells us
            // which column in the state table to look at.
            // Note:  the 16 in UTRIE_GET16 refers to the size of the data being returned,
            //        not the size of the character going in, which is a UChar32.
            //
            category = UTRIE2_GET16(fData->fTrie, c);

            // Check the dictionary bit in the character's category.
            //    Counter is only used by dictionary based iteration.
            //    Chars that need to be handled by a dictionary have a flag bit set
            //    in their category values.
            //
            if ((category & 0x4000) != 0)  {
                fDictionaryCharCount++;
                //  And off the dictionary flag bit.
                category &= ~0x4000;
            }
        }

       #ifdef RBBI_DEBUG
            if (gTrace) {
                RBBIDebugPrintf("             %4" PRId64 "   ", utext_getNativeIndex(&fText));
                if (0x20<=c && c<0x7f) {
                    RBBIDebugPrintf("\"%c\"  ", c);
                } else {
                    RBBIDebugPrintf("%5x  ", c);
                }
                RBBIDebugPrintf("%3d  %3d\n", state, category);
            }
        #endif

        // State Transition - move machine to its next state
        //

        // fNextState is a variable-length array.
        U_ASSERT(category<fData->fHeader->fCatCount);
        state = row->fNextState[category];  /*Not accessing beyond memory*/
        row = (RBBIStateTableRow *)
            // (statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


        if (row->fAccepting == -1) {
            // Match found, common case.
            if (mode != RBBI_START) {
                result = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            }
            fRuleStatusIndex = row->fTagIdx;   // Remember the break status (tag) values.
        }

        int16_t completedRule = row->fAccepting;
        if (completedRule > 0) {
            // Lookahead match is completed.
            int32_t lookaheadResult = lookAheadMatches.getPosition(completedRule);
            if (lookaheadResult >= 0) {
                fRuleStatusIndex = row->fTagIdx;
                fPosition = lookaheadResult;
                return lookaheadResult;
            }
        }
        int16_t rule = row->fLookAhead;
        if (rule != 0) {
            // At the position of a '/' in a look-ahead match. Record it.
            int32_t  pos = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            lookAheadMatches.setPosition(rule, pos);
        }

        if (state == STOP_STATE) {
            // This is the normal exit from the lookup state machine.
            // We have advanced through the string until it is certain that no
            //   longer match is possible, no matter what characters follow.
            break;
        }

        // Advance to the next character.
        // If this is a beginning-of-input loop iteration, don't advance
        //    the input position.  The next iteration will be processing the
        //    first real input character.
        if (mode == RBBI_RUN) {
            c = UTEXT_NEXT32(&fText);
        } else {
            if (mode == RBBI_START) {
                mode = RBBI_RUN;
            }
        }
    }

    // The state machine is done.  Check whether it found a match...

    // If the iterator failed to advance in the match engine, force it ahead by one.
    //   (This really indicates a defect in the break rules.  They should always match
    //    at least one character.)
    if (result == initialPosition) {
        utext_setNativeIndex(&fText, initialPosition);
        utext_next32(&fText);
        result = (int32_t)utext_getNativeIndex(&fText);
        fRuleStatusIndex = 0;
    }

    // Leave the iterator at our result position.
    fPosition = result;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPrintf("result = %d\n\n", result);
        }
    #endif
    return result;
}